

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_api.cc
# Opt level: O0

string * __thiscall
re2c::InputAPI::stmt_backupctx_abi_cxx11_
          (string *__return_storage_ptr__,InputAPI *this,uint32_t ind)

{
  opt_t *poVar1;
  uint32_t extraout_EDX;
  uint32_t extraout_EDX_00;
  uint32_t extraout_EDX_01;
  uint32_t ind_00;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string s;
  uint32_t ind_local;
  InputAPI *this_local;
  
  s.field_2._12_4_ = ind;
  std::__cxx11::string::string((string *)local_40);
  if (this->type_ == DEFAULT) {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_80,&poVar1->yyctxmarker," = ");
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(&local_60,&local_80,&poVar1->yycursor);
    std::__cxx11::string::operator=((string *)local_40,(string *)&local_60);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_80);
    ind_00 = extraout_EDX_00;
  }
  else {
    ind_00 = extraout_EDX;
    if (this->type_ == CUSTOM) {
      poVar1 = Opt::operator->((Opt *)&opts);
      std::operator+(&local_b0,&poVar1->yybackupctx," ()");
      std::__cxx11::string::operator=((string *)local_40,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      ind_00 = extraout_EDX_01;
    }
  }
  indent_abi_cxx11_(&local_f0,(re2c *)(ulong)(uint)s.field_2._12_4_,ind_00);
  std::operator+(&local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
  std::operator+(__return_storage_ptr__,&local_d0,";\n");
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string InputAPI::stmt_backupctx (uint32_t ind) const
{
	std::string s;
	switch (type_)
	{
		case DEFAULT:
			s = opts->yyctxmarker + " = " + opts->yycursor;
			break;
		case CUSTOM:
			s = opts->yybackupctx + " ()";
			break;
	}
	return indent (ind) + s + ";\n";
}